

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::WorldCoordinates::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,WorldCoordinates *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::operator<<(local_188,"X: ");
  poVar1 = std::ostream::_M_insert<double>((double)this->m_f64X);
  std::operator<<(poVar1,",  Y: ");
  poVar1 = std::ostream::_M_insert<double>((double)this->m_f64Y);
  std::operator<<(poVar1,",  Z: ");
  poVar1 = std::ostream::_M_insert<double>((double)this->m_f64Z);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString WorldCoordinates::GetAsString() const
{
    KStringStream ss;

    ss << "X: "    << m_f64X
       << ",  Y: " << m_f64Y
       << ",  Z: " << m_f64Z << "\n";

    return ss.str();
}